

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O3

LY_ERR lyd_parser_check_keys(lyd_node *node)

{
  long lVar1;
  lysc_node *last;
  lys_module *plVar2;
  
  if (node->schema->nodetype != 0x10) {
    __assert_fail("node->schema->nodetype == LYS_LIST",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_common.c"
                  ,0x170,"LY_ERR lyd_parser_check_keys(struct lyd_node *)");
  }
  lVar1._0_4_ = node[1].hash;
  lVar1._4_4_ = node[1].flags;
  last = lys_getnext((lysc_node *)0x0,node->schema,(lysc_module *)0x0,0);
  while( true ) {
    if ((last == (lysc_node *)0x0) || ((last->flags & 0x100) == 0)) {
      return LY_SUCCESS;
    }
    if ((lVar1 == 0) || (*(lysc_node **)(lVar1 + 8) != last)) break;
    lVar1 = *(long *)(lVar1 + 0x18);
    last = lys_getnext(last,node->schema,(lysc_module *)0x0,0);
  }
  if (node->schema == (lysc_node *)0x0) {
    plVar2 = (lys_module *)&node[2].schema;
  }
  else {
    plVar2 = node->schema->module;
  }
  ly_vlog(plVar2->ctx,(char *)0x0,LYVE_DATA,"List instance is missing its key \"%s\".",last->name);
  return LY_EVALID;
}

Assistant:

LY_ERR
lyd_parser_check_keys(struct lyd_node *node)
{
    const struct lysc_node *skey = NULL;
    const struct lyd_node *key;

    assert(node->schema->nodetype == LYS_LIST);

    key = lyd_child(node);
    while ((skey = lys_getnext(skey, node->schema, NULL, 0)) && (skey->flags & LYS_KEY)) {
        if (!key || (key->schema != skey)) {
            LOGVAL(LYD_CTX(node), LY_VCODE_NOKEY, skey->name);
            return LY_EVALID;
        }

        key = key->next;
    }

    return LY_SUCCESS;
}